

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal
          (ChElementBeamIGA *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  long lVar1;
  ChVectorDynamic<> *this_00;
  char cVar2;
  undefined8 uVar3;
  int iVar4;
  Scalar *pSVar5;
  ChQuadratureTables *pCVar6;
  pointer psVar7;
  double *pdVar8;
  pointer psVar9;
  int i_1;
  double dVar10;
  int istride;
  int i;
  long lVar11;
  ChElementBeamIGA *pCVar12;
  double startRow;
  ulong index;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar16 [64];
  int mrows_w;
  ChState state_x_inc;
  ChMatrixDynamic<> Mloc;
  double node_multiplier_fact_K;
  double node_multiplier_fact_R;
  ChVectorDynamic<> Q1;
  ChMatrixDynamic<> K;
  ChVectorDynamic<> Jcolumn;
  ChVectorDynamic<> Q0;
  ChStateDelta state_delta;
  ChStateDelta state_w;
  ChState state_x;
  ChMatrixNM<double,_6,_6> matr_loc;
  ChMatrixNM<double,_6,_6> KRi_loc;
  int local_474;
  double *local_470;
  ChElementBeamIGA *local_468;
  double local_460;
  double local_458;
  ChState local_450;
  LhsNested *local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 local_420;
  DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  *local_418;
  Matrix<double,__1,__1,_1,__1,__1> local_410;
  double local_3f8;
  double local_3f0;
  Matrix<double,__1,_1,_0,__1,_1> local_3e8;
  double *local_3d8;
  double local_3d0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3c8;
  Matrix<double,_3,_3,_1,_3,_3> local_3b8;
  double local_370;
  long local_368;
  Matrix<double,__1,_1,_0,__1,_1> local_360;
  Matrix<double,__1,_1,_0,__1,_1> local_350;
  ChStateDelta local_340 [2];
  ChStateDelta local_310;
  ChState local_2f8;
  ChVectorDynamic<> *local_2e0;
  double local_2d8;
  double local_2d0;
  long local_2c8;
  double local_2c0;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_2b8;
  __shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_2a0 [2];
  element_type local_1f8 [5];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_180 [2];
  
  auVar16._8_56_ = in_register_00001288;
  auVar16._0_8_ = Mfactor;
  lVar11 = (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value;
  local_468 = this;
  local_3f0 = Kfactor;
  local_3d8 = (double *)Rfactor;
  local_3d0 = Mfactor;
  if ((lVar11 != ((long)(this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * 6) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != lVar11)) {
    __assert_fail("(H.rows() == 6 * nodes.size()) && (H.cols() == 6 * nodes.size())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamIGA.cpp"
                  ,0xd3,
                  "virtual void chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  local_418 = (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               *)H;
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamIGA.cpp"
                  ,0xd4,
                  "virtual void chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  iVar4 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[0x1e])(this);
  ChState::ChState(&local_2f8,(long)iVar4,(ChIntegrable *)0x0);
  iVar4 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[0x1f])(this);
  ChStateDelta::ChStateDelta(&local_310,(long)iVar4,(ChIntegrable *)0x0);
  pCVar12 = local_468;
  (*(local_468->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x20])(local_468,0,&local_2f8);
  (*(pCVar12->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x21])(pCVar12,0,&local_310);
  local_474 = (*(pCVar12->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[0x1f])(pCVar12);
  iVar4 = (*(pCVar12->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[0x1e])(pCVar12);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_350,&local_474);
  ComputeInternalForces_impl(local_468,&local_350,&local_2f8,&local_310,true);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3c8,&local_474);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_360,&local_474);
  if ((local_3f0 != 0.0) || (NAN(local_3f0))) {
    Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,1,_1,_1> *)&local_3b8,&local_474,&local_474);
    ChState::ChState(&local_450,(long)iVar4,(ChIntegrable *)0x0);
    ChStateDelta::ChStateDelta(local_340,(long)local_474,(ChIntegrable *)0x0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_340,(long)local_474
              );
    local_340[0].integrable = (ChIntegrable *)0x0;
    for (lVar11 = 0; lVar11 < local_474; lVar11 = lVar11 + 1) {
      local_470 = (double *)Delta;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_340,
                          lVar11);
      *pSVar5 = (double)local_470 + *pSVar5;
      (*(local_468->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[0x22])(local_468,0,&local_450,&local_2f8,0,local_340);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                (&local_3c8,(long)local_474);
      ComputeInternalForces_impl
                (local_468,(ChVectorDynamic<> *)&local_3c8,&local_450,&local_310,true);
      local_470 = (double *)Delta;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_340,
                          lVar11);
      *pSVar5 = *pSVar5 - (double)local_470;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_180,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_3c8,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_350);
      local_410.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)(-1.0 / Delta);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::operator*(local_2a0,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                   *)local_180,(double *)&local_410);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                (&local_360,local_2a0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_2a0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_3b8,lVar11);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_2a0,
                 &local_360);
    }
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                      *)local_180,&local_3f0,(StorageBaseType *)&local_3b8);
    Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
    block<int,int>((Type *)local_2a0,local_418,0,0,local_474,local_474);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
              ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                *)local_2a0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)local_180);
    Eigen::internal::handmade_aligned_free
              (local_340[0].super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (local_450.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              ((void *)local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[0]);
  }
  else {
    Eigen::
    DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
    setZero(local_418);
  }
  if (((double)local_3d8 != 0.0) || (NAN((double)local_3d8))) {
    std::__shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2> *)local_2a0
               ,&(((local_468->section).
                   super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->damping).
                 super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>);
    uVar3 = local_2a0[0]._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_2a0 + 8));
    if ((element_type *)uVar3 != (element_type *)0x0) {
      ChStateDelta::ChStateDelta((ChStateDelta *)&local_3b8,(long)local_474,(ChIntegrable *)0x0);
      ChStateDelta::operator=((ChStateDelta *)&local_3b8,&local_310);
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&local_450,&local_474,&local_474);
      for (lVar11 = 0; lVar11 < local_474; lVar11 = lVar11 + 1) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                  (&local_3c8,(long)local_474);
        local_470 = (double *)Delta;
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_3b8
                            ,lVar11);
        *pSVar5 = (double)local_470 + *pSVar5;
        ComputeInternalForces_impl
                  (local_468,(ChVectorDynamic<> *)&local_3c8,&local_2f8,(ChStateDelta *)&local_3b8,
                   true);
        local_470 = (double *)Delta;
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_3b8
                            ,lVar11);
        *pSVar5 = *pSVar5 - (double)local_470;
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_180,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_3c8,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_350);
        local_340[0].super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)(-1.0 / Delta);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
        ::operator*(local_2a0,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                     *)local_180,(double *)local_340);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                  (&local_360,local_2a0);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_2a0,
                   (Matrix<double,__1,__1,_1,__1,__1> *)&local_450,lVar11);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_2a0,
                   &local_360);
      }
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                        *)local_180,(double *)&local_3d8,(StorageBaseType *)&local_450);
      Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
      block<int,int>((Type *)local_2a0,local_418,0,0,local_474,local_474);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
      ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                    *)local_2a0,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                    *)local_180);
      Eigen::internal::handmade_aligned_free
                (local_450.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      Eigen::internal::handmade_aligned_free
                ((void *)local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[0]);
    }
  }
  auVar15 = auVar16._0_16_;
  local_470 = local_3d8;
  if (((double)local_3d8 != 0.0) || (NAN((double)local_3d8))) {
    std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2b0,
               &(((local_468->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->inertia).
                super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
    auVar15 = auVar16._0_16_;
    if ((local_2b0._M_ptr)->compute_inertia_damping_matrix == false) {
      if ((local_3f0 == 0.0) && (!NAN(local_3f0))) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0._M_refcount);
        goto LAB_00baeebd;
      }
      goto LAB_00baeb22;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0._M_refcount);
  }
  else {
    if ((local_3f0 == 0.0) && (!NAN(local_3f0))) goto LAB_00baeebd;
LAB_00baeb22:
    std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)local_2a0
               ,&(((local_468->section).
                   super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->inertia).
                 super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
    cVar2 = *(char *)&((PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                      (local_2a0[0]._0_8_ + 0x11))->m_storage;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_2a0 + 8));
    if (((double)local_470 != 0.0) || (NAN((double)local_470))) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0._M_refcount);
    }
    auVar15 = auVar16._0_16_;
    if (cVar2 == '\0') goto LAB_00baeebd;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_180);
  startRow = 0.0;
  dVar10 = 0.0;
  pdVar8 = (double *)0x0;
  local_3f8 = (local_468->super_ChElementBeam).length * 0.5;
  local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)(local_3f8 * (double)local_3d8);
  local_3f8 = local_3f8 * local_3f0;
  while( true ) {
    pCVar12 = local_468;
    auVar15 = auVar16._0_16_;
    if ((double *)
        ((long)(local_468->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(local_468->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) <= pdVar8) break;
    local_470 = pdVar8;
    std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)
               &local_3b8,
               &(((local_468->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->inertia).
                super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
    cVar2 = *(char *)((((PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)
                       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[0])->m_storage).m_data.array + 2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array + 1));
    if (cVar2 == '\x01') {
      std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_450,
                 &(((pCVar12->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
      pdVar8 = local_450.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      ChFrameMoving<double>::GetWvel_loc
                ((ChVector<double> *)&local_3b8,
                 (ChFrameMoving<double> *)
                 (*(long *)((long)&(((pCVar12->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + (long)dVar10) + 0x18));
      (**(code **)(*(long *)(undefined1 *)pdVar8 + 0x18))
                (pdVar8,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_2a0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                  *)&local_3b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_450.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                  *)&local_3b8,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_2a0,
                 (double *)&local_3e8);
      Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_180,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>_>
                  *)&local_3b8);
      pCVar12 = local_468;
    }
    std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)
               &local_3b8,
               &(((pCVar12->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->inertia).
                super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
    cVar2 = *(char *)((long)(((PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)
                             local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                             m_storage.m_data.array[0])->m_storage).m_data.array + 0x11);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array + 1));
    pCVar12 = local_468;
    if (cVar2 == '\x01') {
      std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_410,
                 &(((local_468->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
      pdVar8 = local_410.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data;
      ChFrameMoving<double>::GetWvel_loc
                ((ChVector<double> *)&local_3b8,
                 (ChFrameMoving<double> *)
                 (*(long *)((long)&(((pCVar12->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + (long)dVar10) + 0x18));
      local_460 = startRow;
      ChFrameMoving<double>::GetWacc_loc
                ((ChVector<double> *)&local_450,
                 (ChFrameMoving<double> *)
                 (*(long *)((long)&(((pCVar12->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + (long)dVar10) + 0x18));
      psVar7 = (pCVar12->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2b8.m_matrix =
           (non_const_type)
           (*(long *)((long)&(psVar7->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + (long)dVar10) + 0x58);
      local_458 = dVar10;
      chrono::operator*(&local_2b8,
                        (ChVector<double> *)
                        (*(long *)((long)&(psVar7->
                                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + (long)dVar10) + 0xd8));
      (*(*(_func_int ***)pdVar8)[4])
                (pdVar8,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_2a0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                  *)&local_3b8,&local_450,local_340);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_410.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_rows);
      Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                  *)&local_3b8,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_2a0,&local_3f8);
      Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_180,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>_>
                  *)&local_3b8);
      dVar10 = local_458;
      startRow = local_460;
    }
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)&stack0xffffffffffffff28;
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
         = (double)local_180;
    lVar11 = (long)startRow + 3;
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
         = 1.48219693752374e-323;
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
         = 1.48219693752374e-323;
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
         = 2.96439387504748e-323;
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_3,_false>
             *)&local_450,
            (Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)local_418,
            lVar11,lVar11);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,3,3,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>>
                  *)&local_450,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>_> *)
                 &local_3b8);
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = (double)&local_180[0].m_lhs.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.
                    m_xpr;
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
         = (double)local_180;
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)(*(long *)((long)&(((local_468->nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + (long)dVar10) + 0x58);
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
         = 1.48219693752374e-323;
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
         = 2.96439387504748e-323;
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_3,_false>
             *)&local_450,
            (Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)local_418,
            (Index)startRow,lVar11);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,3,3,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>>
                  *)&local_450,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>_>
                  *)&local_3b8);
    dVar10 = (double)((long)dVar10 + 0x10);
    startRow = (double)((long)startRow + 6);
    pdVar8 = (double *)((long)local_470 + 1);
  }
LAB_00baeebd:
  if ((local_3d0 != 0.0) || (NAN(local_3d0))) {
    local_2a0[0]._0_8_ =
         ((long)(local_468->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_468->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) * 6;
    local_180[0].m_lhs.m_lhs = (LhsNested)local_2a0[0]._0_8_;
    Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<unsigned_long,unsigned_long>
              ((Matrix<double,_1,_1,1,_1,_1> *)&local_410,(unsigned_long *)local_2a0,
               (unsigned_long *)local_180);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_410);
    pCVar12 = local_468;
    if (lumped_mass == '\x01') {
      std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)
                 local_180,
                 &(((local_468->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
      (**(code **)((long)((local_180[0].m_lhs.m_lhs)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                         m_data.array[0] + 0x10))(local_180[0].m_lhs.m_lhs,local_2a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180[0].m_lhs.m_rhs);
      psVar7 = (pCVar12->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar9 = (pCVar12->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = 0;
      local_460 = 0.0;
      auVar15 = vcvtusi2sd_avx512f(auVar15,(long)psVar7 - (long)psVar9 >> 4);
      local_470 = (double *)(((pCVar12->super_ChElementBeam).length / auVar15._0_8_) * local_3d0);
      for (local_458 = 0.0; (ulong)local_458 < (ulong)((long)psVar7 - (long)psVar9 >> 4);
          local_458 = (double)((long)local_458 + 1)) {
        local_450.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)local_2a0;
        local_438 = (LhsNested *)0x0;
        uStack_430 = 0;
        local_428 = 6;
        local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             local_470;
        local_450.integrable =
             (ChIntegrable *)
             local_450.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>>::operator*
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)local_180,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>> *)&local_450
                   ,(double *)&local_3e8);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_340,
                   &local_410,lVar11,lVar11);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                   local_340,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                    *)local_180);
        local_450.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)local_1f8;
        local_450.integrable = (ChIntegrable *)local_2a0;
        local_438 = (LhsNested *)0x3;
        uStack_430 = 3;
        local_428 = 6;
        local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             local_470;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>>::operator*
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)local_180,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>> *)&local_450
                   ,(double *)&local_3e8);
        lVar1 = lVar11 + 3;
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_340,
                   &local_410,lVar1,lVar1);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                   local_340,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                    *)local_180);
        local_450.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (long)local_2a0 + 0x18;
        local_438 = (LhsNested *)local_2a0;
        local_340[0].super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = local_470;
        local_450.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)
             (*(long *)((long)&(((local_468->nodes).
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + (long)local_460) + 0x58);
        uStack_430 = 0;
        local_428 = 3;
        local_420 = 6;
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>>
        ::operator*(local_180,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>>
                     *)&local_450,(double *)local_340);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                  (&local_3b8,local_180);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_180,
                   &local_410,lVar11,lVar1);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                   local_180,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_3b8);
        local_450.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)&local_3b8;
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_180,
                   &local_410,lVar1,lVar11);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                   local_180,
                   (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)
                   &local_450);
        local_460 = (double)((long)local_460 + 0x10);
        lVar11 = lVar11 + 6;
        psVar9 = (local_468->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = (local_468->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else {
      std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)
                 local_180,
                 &(((local_468->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
      (**(code **)((long)((local_180[0].m_lhs.m_lhs)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                         m_data.array[0] + 0x10))(local_180[0].m_lhs.m_lhs,local_2a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180[0].m_lhs.m_rhs);
      this_00 = &pCVar12->knots;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          (long)pCVar12->order);
      local_470 = (double *)*pSVar5;
      local_2e0 = this_00;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          ~(long)pCVar12->order +
                          (pCVar12->knots).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows);
      local_370 = (*pSVar5 - (double)local_470) * 0.5;
      local_2d8 = ((double)local_470 + *pSVar5) * 0.5;
      for (local_368 = 0; local_368 < local_468->int_order_b; local_368 = local_368 + 1) {
        pCVar6 = ChQuadrature::GetStaticTables();
        lVar11 = local_368;
        pCVar12 = local_468;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_2d8;
        auVar14._8_8_ = 0;
        auVar14._0_8_ =
             *(ulong *)(*(long *)&(pCVar6->Lroots).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)local_468->int_order_b + -1].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data + local_368 * 8);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_370;
        auVar15 = vfmadd132sd_fma(auVar14,auVar13,auVar15);
        local_470 = auVar15._0_8_;
        pCVar6 = ChQuadrature::GetStaticTables();
        local_460 = *(double *)
                     (*(long *)&(pCVar6->Weight).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [(long)pCVar12->int_order_b + -1].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl +
                     lVar11 * 8);
        local_458 = (pCVar12->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar11];
        iVar4 = pCVar12->order;
        local_180[0].m_lhs.m_lhs =
             (LhsNested)
             CONCAT44(local_180[0].m_lhs.m_lhs._4_4_,
                      (int)((ulong)((long)(pCVar12->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pCVar12->nodes).
                                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_3e8,(int *)local_180);
        geometry::ChBasisToolsBspline::BasisEvaluate
                  (pCVar12->order,iVar4,(double)local_470,local_2e0,&local_3e8);
        psVar7 = (pCVar12->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar9 = (pCVar12->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_2d0 = local_460 * local_3d0 * local_458 * local_370;
        for (index = 0; index < (ulong)((long)psVar9 - (long)psVar7 >> 4); index = index + 1) {
          lVar11 = index * 6;
          local_2c8 = index << 4;
          local_470 = (double *)0x0;
          local_458 = (double)(lVar11 + 3);
          for (local_460 = 0.0; (ulong)local_460 < (ulong)((long)psVar9 - (long)psVar7 >> 4);
              local_460 = (double)((long)local_460 + 1)) {
            pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &local_3e8,index);
            local_2c0 = *pSVar5;
            pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &local_3e8,(Index)local_460);
            local_450.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                 (double *)local_2a0;
            local_3f8 = local_2c0 * *pSVar5 * local_2d0;
            local_438 = (LhsNested *)0x0;
            uStack_430 = 0;
            local_428 = 6;
            local_450.integrable =
                 (ChIntegrable *)
                 local_450.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>>::operator*
                      ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        *)local_180,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>> *)
                       &local_450,&local_3f8);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_340,
                       &local_410,lVar11,(Index)local_470);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::
            operator+=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                       local_340,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                        *)local_180);
            local_450.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                 (double *)local_1f8;
            local_450.integrable = (ChIntegrable *)local_2a0;
            local_438 = (LhsNested *)0x3;
            uStack_430 = 3;
            local_428 = 6;
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>>::operator*
                      ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        *)local_180,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>> *)
                       &local_450,&local_3f8);
            lVar1 = (long)local_470 + 3;
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_340,
                       &local_410,(Index)local_458,lVar1);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::
            operator+=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                       local_340,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                        *)local_180);
            local_450.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
                 (long)local_2a0 + 0x18;
            local_438 = (LhsNested *)local_2a0;
            local_450.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                 (double *)
                 (*(long *)((long)&(((local_468->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + local_2c8) + 0x58);
            uStack_430 = 0;
            local_428 = 3;
            local_420 = 6;
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>>
            ::operator*(local_180,
                        (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>>
                         *)&local_450,&local_3f8);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                      (&local_3b8,local_180);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_180,
                       &local_410,lVar11,lVar1);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::
            operator+=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                       local_180,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_3b8);
            local_450.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                 (double *)&local_3b8;
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_180,
                       &local_410,(Index)local_458,(Index)local_470);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::
            operator+=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                       local_180,
                       (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)
                       &local_450);
            local_470 = (double *)((long)local_470 + 6);
            psVar7 = (local_468->nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar9 = (local_468->nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        Eigen::internal::handmade_aligned_free
                  (local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data);
      }
    }
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)local_2a0,
            (Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)local_418,0
            ,0,local_410.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_rows,
            local_410.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                  *)local_2a0,(MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_410);
    Eigen::internal::handmade_aligned_free
              (local_410.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data);
  }
  Eigen::internal::handmade_aligned_free
            (local_360.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free(local_3c8.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_350.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (local_310.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_2f8.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 6 * nodes.size()) && (H.cols() == 6 * nodes.size()));
    assert(section);

    // BRUTE FORCE METHOD: USE NUMERICAL DIFFERENTIATION!

    //
    // The K stiffness matrix of this element span:
    //

    ChState state_x(this->LoadableGet_ndof_x(), nullptr);
    ChStateDelta state_w(this->LoadableGet_ndof_w(), nullptr);
    this->LoadableGetStateBlock_x(0, state_x);
    this->LoadableGetStateBlock_w(0, state_w);

    int mrows_w = this->LoadableGet_ndof_w();
    int mrows_x = this->LoadableGet_ndof_x();

    // compute Q at current speed & position, x_0, v_0
    ChVectorDynamic<> Q0(mrows_w);
    this->ComputeInternalForces_impl(Q0, state_x, state_w, true);  // Q0 = Q(x, v)

    ChVectorDynamic<> Q1(mrows_w);
    ChVectorDynamic<> Jcolumn(mrows_w);

    if (Kfactor) {
        ChMatrixDynamic<> K(mrows_w, mrows_w);

        ChState state_x_inc(mrows_x, nullptr);
        ChStateDelta state_delta(mrows_w, nullptr);

        // Compute K=-dQ(x,v)/dx by backward differentiation
        state_delta.setZero(mrows_w, nullptr);

        for (int i = 0; i < mrows_w; ++i) {
            state_delta(i) += Delta;
            this->LoadableStateIncrement(0, state_x_inc, state_x, 0,
                                         state_delta);  // exponential, usually state_x_inc(i) = state_x(i) + Delta;

            Q1.setZero(mrows_w);
            this->ComputeInternalForces_impl(Q1, state_x_inc, state_w, true);  // Q1 = Q(x+Dx, v)
            state_delta(i) -= Delta;

            Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because K=-dQ/dx
            K.col(i) = Jcolumn;
        }

        // finally, store K into H:
        H.block(0, 0, mrows_w, mrows_w) = Kfactor * K;
    } else
        H.setZero();

    //
    // The R damping matrix of this element:
    //

    if (Rfactor && this->section->GetDamping()) {
        // Compute R=-dQ(x,v)/dv by backward differentiation
        ChStateDelta state_w_inc(mrows_w, nullptr);
        state_w_inc = state_w;
        ChMatrixDynamic<> R(mrows_w, mrows_w);

        for (int i = 0; i < mrows_w; ++i) {
            Q1.setZero(mrows_w);

            state_w_inc(i) += Delta;
            this->ComputeInternalForces_impl(Q1, state_x, state_w_inc, true);  // Q1 = Q(x, v+Dv)
            state_w_inc(i) -= Delta;

            Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because R=-dQ/dv
            R.col(i) = Jcolumn;
        }
        H.block(0, 0, mrows_w, mrows_w) += Rfactor * R;
    }

    // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping),
    // if enabled in section material.
    // These matrices are not symmetric.
    // A lumped version of the inertial damping/stiffness matrix computation is used here,
    // on a per-node basis. In future one could implement also a consistent version of it, optionally, depending on
    // ChElementBeamIGA::lumped_mass.
    if ((Rfactor && this->section->GetInertia()->compute_inertia_damping_matrix) ||
        (Kfactor && this->section->GetInertia()->compute_inertia_stiffness_matrix)) {
        ChMatrixNM<double, 6, 6> matr_loc;
        ChMatrixNM<double, 6, 6> KRi_loc;
        KRi_loc.setZero();

        double node_multiplier_fact_R = 0.5 * length * Rfactor;
        double node_multiplier_fact_K = 0.5 * length * Kfactor;
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6;
            if (this->section->GetInertia()->compute_inertia_damping_matrix) {
                this->section->GetInertia()->ComputeInertiaDampingMatrix(matr_loc, nodes[i]->GetWvel_loc());
                KRi_loc += matr_loc * node_multiplier_fact_R;
            }
            if (this->section->GetInertia()->compute_inertia_stiffness_matrix) {
                this->section->GetInertia()->ComputeInertiaStiffnessMatrix(
                    matr_loc, nodes[i]->GetWvel_loc(), nodes[i]->GetWacc_loc(),
                    (nodes[i]->GetA().transpose()) * nodes[i]->GetPos_dtdt());  // assume x_dtdt in local frame!
                KRi_loc += matr_loc * node_multiplier_fact_K;
            }
            // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
            // H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) *
            // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by construction
            H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
            H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
            // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) *
            // (nodes[i]->GetA().transpose());  // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by construction
        }
    }

    //
    // The M mass matrix of this element span:
    //

    if (Mfactor) {
        ChMatrixDynamic<> Mloc(6 * nodes.size(), 6 * nodes.size());
        Mloc.setZero();
        ChMatrix33<> Mxw;

        if (ChElementBeamIGA::lumped_mass == true) {
            //
            // "lumped" M mass matrix
            //
            ChMatrixNM<double, 6, 6> sectional_mass;
            this->section->GetInertia()->ComputeInertiaMatrix(sectional_mass);

            double node_multiplier = length / (double)nodes.size();
            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                // hence it can be the simple (constant) expression
                //   Mloc.block<6, 6>(stride, stride) += sectional_mass * (node_multiplier * Mfactor);
                // but the more general case needs the rotations, hence:
                Mloc.block<3, 3>(stride, stride) += sectional_mass.block<3, 3>(0, 0) * (node_multiplier * Mfactor);
                Mloc.block<3, 3>(stride + 3, stride + 3) +=
                    sectional_mass.block<3, 3>(3, 3) * (node_multiplier * Mfactor);
                Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0, 3) * (node_multiplier * Mfactor);
                Mloc.block<3, 3>(stride, stride + 3) += Mxw;
                Mloc.block<3, 3>(stride + 3, stride) += Mxw.transpose();
            }
        } else {
            //
            // "consistent" M mass matrix, via Gauss quadrature
            //
            ChMatrixNM<double, 6, 6> sectional_mass;
            this->section->GetInertia()->ComputeInertiaMatrix(sectional_mass);

            double u1 = knots(order);
            double u2 = knots(knots.size() - order - 1);

            double c1 = (u2 - u1) / 2;
            double c2 = (u2 + u1) / 2;

            // Do quadrature over the Gauss points - reuse the "b" bend Gauss points

            for (int ig = 0; ig < int_order_b; ++ig) {
                // absyssa in typical -1,+1 range:
                double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
                // absyssa in span range:
                double u = (c1 * eta + c2);
                // scaling = gauss weight
                double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

                // Jacobian Jsu = ds/du
                double Jsu = this->Jacobian_b[ig];
                // Jacobian Jue = du/deta
                double Jue = c1;

                // compute the basis functions N(u) at given u:
                int nspan = order;

                ChVectorDynamic<> N((int)nodes.size());
                geometry::ChBasisToolsBspline::BasisEvaluate(this->order, nspan, u, knots, N);

                /*
                // interpolate rotation of section at given u, to compute R.
                ChQuaternion<> q_delta;
                ChVector<> da = VNULL;
                ChVector<> delta_rot_dir;
                double delta_rot_angle;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
                    q_delta.Q_to_AngAxis(delta_rot_angle, delta_rot_dir); // a_i = dir_i*angle_i (in spline local
                reference, -PI..+PI) da += delta_rot_dir * delta_rot_angle * N(i);  // a = N_i*a_i
                }
                ChQuaternion<> qda; qda.Q_from_Rotv(da);
                ChQuaternion<> qR = nodes[0]->coord.rot * qda;

                // compute the 3x3 rotation matrix R equivalent to quaternion above
                ChMatrix33<> R(qR);
                */

                // A simplification, for moderate bending, ignore the difference between beam section R
                // and R_i of nearby nodes, obtaining:

                for (int i = 0; i < nodes.size(); ++i) {
                    for (int j = 0; j < nodes.size(); ++j) {
                        int istride = i * 6;
                        int jstride = j * 6;

                        double Ni_Nj = N(i) * N(j);
                        double gmassfactor = Mfactor * w * Jsu * Jue * Ni_Nj;

                        // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                        // hence it can be the simple (constant) expression
                        //   Mloc.block<6, 6>(istride + 0, jstride + 0) += gmassfactor * sectional_mass;
                        // but the more general case needs the rotations, hence:
                        Mloc.block<3, 3>(istride, jstride) += sectional_mass.block<3, 3>(0, 0) * gmassfactor;
                        Mloc.block<3, 3>(istride + 3, jstride + 3) += sectional_mass.block<3, 3>(3, 3) * gmassfactor;
                        Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0, 3) * gmassfactor;
                        Mloc.block<3, 3>(istride, jstride + 3) += Mxw;
                        Mloc.block<3, 3>(istride + 3, jstride) += Mxw.transpose();
                    }
                }

            }  // end loop on gauss points
        }

        H.block(0, 0, Mloc.rows(), Mloc.cols()) += Mloc;
    }
}